

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util.cc
# Opt level: O1

bool google::protobuf::internal::InitializeEnumStrings
               (EnumEntry *enums,int *sorted_indices,size_t size,
               ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *enum_strings)

{
  char *pcVar1;
  long lVar2;
  size_t sVar3;
  
  if (size != 0) {
    sVar3 = 0;
    do {
      pcVar1 = enums[sorted_indices[sVar3]].name.ptr_;
      if (pcVar1 == (char *)0x0) {
        *(string **)enum_strings = (string *)((long)enum_strings + 0x10);
        *(undefined8 *)((long)enum_strings + 8) = 0;
        *(string *)((long)enum_strings + 0x10) = (string)0x0;
      }
      else {
        lVar2 = enums[sorted_indices[sVar3]].name.length_;
        *(string **)enum_strings = (string *)((long)enum_strings + 0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)enum_strings,pcVar1,pcVar1 + lVar2);
      }
      OnShutdownRun(DestroyString,enum_strings);
      sVar3 = sVar3 + 1;
      enum_strings = (ExplicitlyConstructed<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)enum_strings + 0x20);
    } while (size != sVar3);
  }
  return true;
}

Assistant:

bool InitializeEnumStrings(
    const EnumEntry* enums, const int* sorted_indices, size_t size,
    internal::ExplicitlyConstructed<std::string>* enum_strings) {
  for (int i = 0; i < size; ++i) {
    enum_strings[i].Construct(enums[sorted_indices[i]].name);
    internal::OnShutdownDestroyString(enum_strings[i].get_mutable());
  }
  return true;
}